

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O0

bool PSBTInputSignedAndVerified
               (PartiallySignedTransaction *psbt,uint input_index,PrecomputedTransactionData *txdata
               )

{
  bool bVar1;
  byte bVar2;
  size_type sVar3;
  const_reference pvVar4;
  const_reference __src;
  long in_RDX;
  uint in_ESI;
  long in_FS_OFFSET;
  PSBTInput *input;
  COutPoint prevout;
  CTxOut utxo;
  undefined4 in_stack_fffffffffffffea8;
  MissingDataBehavior in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  MissingDataBehavior in_stack_fffffffffffffeb4;
  undefined4 in_stack_fffffffffffffeb8;
  undefined2 in_stack_fffffffffffffebc;
  undefined1 in_stack_fffffffffffffebe;
  undefined1 in_stack_fffffffffffffebf;
  CAmount *in_stack_fffffffffffffec0;
  CMutableTransaction *txToIn;
  CTxOut *in_stack_fffffffffffffec8;
  uint nInIn;
  GenericTransactionSignatureChecker<CMutableTransaction> *this;
  CMutableTransaction *in_stack_fffffffffffffed0;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  BaseSignatureChecker *in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff64;
  CScriptWitness *in_stack_ffffffffffffff68;
  CScript *in_stack_ffffffffffffff70;
  CScript *in_stack_ffffffffffffff78;
  undefined1 local_54 [32];
  uint local_34;
  GenericTransactionSignatureChecker<CMutableTransaction> local_28;
  
  local_28.txdata = *(PrecomputedTransactionData **)(in_FS_OFFSET + 0x28);
  CTxOut::CTxOut(in_stack_fffffffffffffec8);
  nInIn = (uint)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  sVar3 = std::vector<PSBTInput,_std::allocator<PSBTInput>_>::size
                    ((vector<PSBTInput,_std::allocator<PSBTInput>_> *)
                     CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  if (sVar3 < in_ESI) {
    __assert_fail("psbt.inputs.size() >= input_index",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/psbt.cpp"
                  ,0x12d,
                  "bool PSBTInputSignedAndVerified(const PartiallySignedTransaction, unsigned int, const PrecomputedTransactionData *)"
                 );
  }
  pvVar4 = std::vector<PSBTInput,_std::allocator<PSBTInput>_>::operator[]
                     ((vector<PSBTInput,_std::allocator<PSBTInput>_> *)
                      CONCAT17(in_stack_fffffffffffffebf,
                               CONCAT16(in_stack_fffffffffffffebe,
                                        CONCAT24(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8
                                                ))),
                      CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  bVar1 = std::__shared_ptr::operator_cast_to_bool
                    ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                     CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  if (bVar1) {
    std::optional<CMutableTransaction>::operator->
              ((optional<CMutableTransaction> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    __src = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                       CONCAT17(in_stack_fffffffffffffebf,
                                CONCAT16(in_stack_fffffffffffffebe,
                                         CONCAT24(in_stack_fffffffffffffebc,
                                                  in_stack_fffffffffffffeb8))),
                       CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    memcpy(local_54,__src,0x24);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    sVar3 = std::vector<CTxOut,_std::allocator<CTxOut>_>::size
                      ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                       CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    if (sVar3 <= local_34) {
      bVar2 = 0;
      goto LAB_01998089;
    }
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    CTransaction::GetHash
              ((CTransaction *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    bVar1 = transaction_identifier<false>::operator!=
                      ((transaction_identifier<false> *)
                       CONCAT17(in_stack_fffffffffffffebf,
                                CONCAT16(in_stack_fffffffffffffebe,
                                         CONCAT24(in_stack_fffffffffffffebc,
                                                  in_stack_fffffffffffffeb8))),
                       (transaction_identifier<false> *)
                       CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    if (bVar1) {
      bVar2 = 0;
      goto LAB_01998089;
    }
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)
               CONCAT17(in_stack_fffffffffffffebf,
                        CONCAT16(in_stack_fffffffffffffebe,
                                 CONCAT24(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8))),
               CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    CTxOut::operator=((CTxOut *)
                      CONCAT17(in_stack_fffffffffffffebf,
                               CONCAT16(in_stack_fffffffffffffebe,
                                        CONCAT24(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8
                                                ))),
                      (CTxOut *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  }
  else {
    bVar1 = CTxOut::IsNull((CTxOut *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    if (bVar1) {
      bVar2 = 0;
      goto LAB_01998089;
    }
    CTxOut::operator=((CTxOut *)
                      CONCAT17(in_stack_fffffffffffffebf,
                               CONCAT16(in_stack_fffffffffffffebe,
                                        CONCAT24(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8
                                                ))),
                      (CTxOut *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  }
  if (in_RDX == 0) {
    txToIn = (CMutableTransaction *)&pvVar4->final_script_sig;
    this = &local_28;
    std::optional<CMutableTransaction>::operator*
              ((optional<CMutableTransaction> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    GenericTransactionSignatureChecker<CMutableTransaction>::GenericTransactionSignatureChecker
              (this,txToIn,
               CONCAT13(in_stack_fffffffffffffebf,
                        CONCAT12(in_stack_fffffffffffffebe,in_stack_fffffffffffffebc)),
               (CAmount *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               in_stack_fffffffffffffeac);
    bVar2 = VerifyScript(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                         in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                         in_stack_ffffffffffffff58,
                         (ScriptError *)
                         CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
    GenericTransactionSignatureChecker<CMutableTransaction>::~GenericTransactionSignatureChecker
              ((GenericTransactionSignatureChecker<CMutableTransaction> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  }
  else {
    std::optional<CMutableTransaction>::operator*
              ((optional<CMutableTransaction> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    GenericTransactionSignatureChecker<CMutableTransaction>::GenericTransactionSignatureChecker
              ((GenericTransactionSignatureChecker<CMutableTransaction> *)
               CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),
               in_stack_fffffffffffffed0,nInIn,in_stack_fffffffffffffec0,
               (PrecomputedTransactionData *)
               CONCAT17(in_stack_fffffffffffffebf,
                        CONCAT16(in_stack_fffffffffffffebe,
                                 CONCAT24(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8))),
               in_stack_fffffffffffffeb4);
    bVar2 = VerifyScript(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                         in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                         in_stack_ffffffffffffff58,
                         (ScriptError *)
                         CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
    GenericTransactionSignatureChecker<CMutableTransaction>::~GenericTransactionSignatureChecker
              ((GenericTransactionSignatureChecker<CMutableTransaction> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  }
LAB_01998089:
  CTxOut::~CTxOut((CTxOut *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  if (*(PrecomputedTransactionData **)(in_FS_OFFSET + 0x28) == local_28.txdata) {
    return (bool)(bVar2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool PSBTInputSignedAndVerified(const PartiallySignedTransaction psbt, unsigned int input_index, const PrecomputedTransactionData* txdata)
{
    CTxOut utxo;
    assert(psbt.inputs.size() >= input_index);
    const PSBTInput& input = psbt.inputs[input_index];

    if (input.non_witness_utxo) {
        // If we're taking our information from a non-witness UTXO, verify that it matches the prevout.
        COutPoint prevout = psbt.tx->vin[input_index].prevout;
        if (prevout.n >= input.non_witness_utxo->vout.size()) {
            return false;
        }
        if (input.non_witness_utxo->GetHash() != prevout.hash) {
            return false;
        }
        utxo = input.non_witness_utxo->vout[prevout.n];
    } else if (!input.witness_utxo.IsNull()) {
        utxo = input.witness_utxo;
    } else {
        return false;
    }

    if (txdata) {
        return VerifyScript(input.final_script_sig, utxo.scriptPubKey, &input.final_script_witness, STANDARD_SCRIPT_VERIFY_FLAGS, MutableTransactionSignatureChecker{&(*psbt.tx), input_index, utxo.nValue, *txdata, MissingDataBehavior::FAIL});
    } else {
        return VerifyScript(input.final_script_sig, utxo.scriptPubKey, &input.final_script_witness, STANDARD_SCRIPT_VERIFY_FLAGS, MutableTransactionSignatureChecker{&(*psbt.tx), input_index, utxo.nValue, MissingDataBehavior::FAIL});
    }
}